

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

ON_Font * ON_Font::FontFromRichTextProperties
                    (ON_wString *rich_text_font_name,bool bBoldQuartetMember,
                    bool bItalicQuartetMember,bool bUnderlined,bool bStrikethrough)

{
  ON_wString *this;
  uchar uVar1;
  bool bVar2;
  Weight WVar3;
  wchar_t *pwVar4;
  ON_Font *pOVar5;
  wchar_t *prefered_face_name;
  ON_Font *pOVar6;
  int *piVar7;
  Weight WVar8;
  Weight WVar9;
  ON_Font *pOVar10;
  undefined7 in_register_00000031;
  Member member;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  ON_wString en_windows_logfont_name;
  ON_wString loc_windows_logfont_name;
  ON_wString en_family_name;
  ON_wString loc_family_name;
  ON_Font *local_1f8;
  ON_wString en_quartet_name;
  ON_wString loc_quartet_name;
  ON_wString local_1e0;
  ON_wString local_1d8;
  ON_wString local_1d0;
  ON_wString local_1c8;
  ON_wString local_1c0;
  ON_wString local_1b8;
  ON_wString local_1b0;
  ON_wString local_1a8;
  ON_wString local_1a0;
  ON_wString local_198;
  ON_wString local_190;
  ON_wString local_188;
  undefined4 local_17c;
  ON_MemoryAllocationTracking disable_tracking;
  ON_FontFaceQuartet local_170;
  ON_FontFaceQuartet managed_substitute_quartet;
  ON_FontFaceQuartet installed_quartet;
  ON_Font fake_font;
  
  ON_wString::TrimLeftAndRight(rich_text_font_name,(wchar_t *)0x0);
  bVar2 = ON_wString::IsEmpty(rich_text_font_name);
  if (bVar2) {
    RichTextFontName(&fake_font,&Default,false);
    ON_wString::operator=(rich_text_font_name,(ON_wString *)&fake_font);
    ON_wString::~ON_wString((ON_wString *)&fake_font);
  }
  member = bItalicQuartetMember * '\x02' + Regular;
  if (bBoldQuartetMember) {
    member = bItalicQuartetMember * '\x02' + Bold;
  }
  ON_ManagedFonts::InstalledFonts();
  pwVar4 = ON_wString::operator_cast_to_wchar_t_(rich_text_font_name);
  ON_FontList::QuartetFromQuartetName
            (&installed_quartet,&ON_ManagedFonts::List.m_installed_fonts,pwVar4);
  if (((((installed_quartet.m_regular == (ON_Font *)0x0) &&
        (installed_quartet.m_bold == (ON_Font *)0x0)) &&
       (CONCAT44(installed_quartet.m_italic._4_4_,installed_quartet.m_italic._0_4_) == 0)) &&
      (CONCAT44(installed_quartet.m_bold_italic._4_4_,installed_quartet.m_bold_italic._0_4_) == 0))
     || (pOVar5 = ON_FontFaceQuartet::ClosestFace(&installed_quartet,member),
        pOVar5 == (ON_Font *)0x0)) {
    pwVar4 = ON_wString::operator_cast_to_wchar_t_(rich_text_font_name);
    ON_FontList::QuartetFromQuartetName
              (&managed_substitute_quartet,&ON_ManagedFonts::List.m_managed_fonts,pwVar4);
    if (((managed_substitute_quartet.m_regular != (ON_Font *)0x0) ||
        (managed_substitute_quartet.m_bold != (ON_Font *)0x0)) ||
       ((managed_substitute_quartet.m_italic != (ON_Font *)0x0 ||
        (managed_substitute_quartet.m_bold_italic != (ON_Font *)0x0)))) {
      pOVar5 = (ON_Font *)
               (*(code *)(&DAT_006bdfd4 + *(int *)(&DAT_006bdfd4 + (ulong)(member - 1) * 4)))();
      return pOVar5;
    }
    ON_MemoryAllocationTracking::ON_MemoryAllocationTracking(&disable_tracking,false);
    ON_wString::ON_wString((ON_wString *)&fake_font,rich_text_font_name);
    ON_wString::operator=(rich_text_font_name,&ON_wString::EmptyString);
    pwVar4 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&fake_font);
    ON_wString::ON_wString(&local_170.m_quartet_name,pwVar4);
    ON_wString::operator=(rich_text_font_name,&local_170.m_quartet_name);
    ON_wString::~ON_wString(&local_170.m_quartet_name);
    ON_wString::~ON_wString((ON_wString *)&fake_font);
    pwVar4 = ON_wString::operator_cast_to_wchar_t_(rich_text_font_name);
    pOVar5 = InstalledFontFromRichTextProperties(pwVar4,bBoldQuartetMember,bItalicQuartetMember);
    if (pOVar5 == (ON_Font *)0x0) {
      ON_ManagedFonts::InstalledFonts();
      pwVar4 = ON_wString::operator_cast_to_wchar_t_(rich_text_font_name);
      pOVar5 = ON_FontList::Internal_FromNames
                         (&ON_ManagedFonts::List.m_installed_fonts,(wchar_t *)0x0,pwVar4,
                          (wchar_t *)0x0,(wchar_t *)0x0,Normal,Condensed,Upright,false,false,false,
                          false,false,0.0);
      if (pOVar5 == (ON_Font *)0x0) {
        ON_ManagedFonts::InstalledFonts();
        pwVar4 = ON_wString::operator_cast_to_wchar_t_(rich_text_font_name);
        pOVar5 = ON_FontList::Internal_FromNames
                           (&ON_ManagedFonts::List.m_installed_fonts,pwVar4,(wchar_t *)0x0,
                            (wchar_t *)0x0,(wchar_t *)0x0,Normal,Condensed,Upright,false,false,true,
                            false,false,0.0);
      }
      if (pOVar5 == (ON_Font *)0x0) {
        ON_ManagedFonts::InstalledFonts();
        pwVar4 = ON_wString::operator_cast_to_wchar_t_(rich_text_font_name);
        ON_wString::ON_wString((ON_wString *)&fake_font,L"Regular");
        prefered_face_name = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&fake_font);
        pOVar5 = ON_FontList::Internal_FromNames
                           (&ON_ManagedFonts::List.m_installed_fonts,(wchar_t *)0x0,(wchar_t *)0x0,
                            pwVar4,prefered_face_name,Normal,Medium,Upright,false,false,false,false,
                            false,0.0);
        ON_wString::~ON_wString((ON_wString *)&fake_font);
      }
      if (pOVar5 == (ON_Font *)0x0) {
        pOVar5 = (ON_Font *)0x0;
      }
      else {
        InstalledFontQuartet((ON_FontFaceQuartet *)&fake_font,pOVar5);
        ON_wString::operator=(&installed_quartet.m_quartet_name,(ON_wString *)&fake_font);
        installed_quartet.m_italic._0_1_ = fake_font.m_font_weight;
        installed_quartet.m_italic._1_1_ = fake_font.m_font_style;
        installed_quartet.m_italic._2_1_ = fake_font.m_font_stretch;
        installed_quartet.m_italic._3_1_ = fake_font.m_font_bUnderlined;
        installed_quartet.m_italic._4_1_ = fake_font.m_font_bStrikethrough;
        installed_quartet.m_italic._5_1_ = fake_font.m_logfont_charset;
        installed_quartet.m_italic._6_1_ = fake_font.m_font_origin;
        installed_quartet.m_italic._7_1_ = fake_font.m_font_type;
        installed_quartet.m_bold_italic._0_4_ = fake_font.m_locale_name.m_s._0_4_;
        installed_quartet.m_bold_italic._4_4_ = fake_font.m_locale_name.m_s._4_4_;
        installed_quartet.m_regular = (ON_Font *)fake_font.m_point_size;
        installed_quartet.m_bold = (ON_Font *)fake_font.m_apple_font_weight_trait;
        ON_wString::~ON_wString((ON_wString *)&fake_font);
        pOVar6 = ON_FontFaceQuartet::ClosestFace
                           (&installed_quartet,bBoldQuartetMember,bItalicQuartetMember);
        in_XMM1_Da = fake_font._24_4_;
        in_XMM1_Db = fake_font._28_4_;
        if (pOVar6 != (ON_Font *)0x0) {
          pOVar5 = pOVar6;
        }
      }
    }
    if (pOVar5 == (ON_Font *)0x0) {
      ON_wString::ON_wString(&loc_quartet_name,rich_text_font_name);
      ON_wString::ON_wString(&en_quartet_name,rich_text_font_name);
      ON_wString::ON_wString(&loc_family_name,rich_text_font_name);
      ON_wString::ON_wString(&en_family_name,rich_text_font_name);
      ON_wString::ON_wString(&loc_windows_logfont_name,rich_text_font_name);
      ON_wString::ON_wString(&en_windows_logfont_name,rich_text_font_name);
      local_17c = (undefined4)CONCAT71(in_register_00000031,bBoldQuartetMember);
      if (((managed_substitute_quartet.m_regular == (ON_Font *)0x0) &&
          (managed_substitute_quartet.m_bold == (ON_Font *)0x0)) &&
         ((managed_substitute_quartet.m_italic == (ON_Font *)0x0 &&
          (managed_substitute_quartet.m_bold_italic == (ON_Font *)0x0)))) {
        WVar3 = Unset;
        WVar9 = Unset;
      }
      else {
        pOVar5 = managed_substitute_quartet.m_italic;
        if (managed_substitute_quartet.m_regular != (ON_Font *)0x0) {
          pOVar5 = managed_substitute_quartet.m_regular;
        }
        pOVar6 = managed_substitute_quartet.m_bold;
        if (managed_substitute_quartet.m_bold == (ON_Font *)0x0) {
          pOVar6 = managed_substitute_quartet.m_bold_italic;
        }
        pOVar10 = pOVar5;
        if (pOVar5 == (ON_Font *)0x0) {
          pOVar10 = pOVar6;
        }
        if (pOVar10 != (ON_Font *)0x0) {
          ON_wString::ON_wString(&local_188,&pOVar10->m_loc_windows_logfont_name);
          ON_wString::ON_wString(&local_190,&pOVar10->m_en_windows_logfont_name);
          Internal_SetFakeNamesFromExistingNames
                    (&local_188,&local_190,&loc_quartet_name,&en_quartet_name);
          ON_wString::~ON_wString(&local_190);
          ON_wString::~ON_wString(&local_188);
          ON_wString::ON_wString(&local_198,&pOVar10->m_loc_family_name);
          ON_wString::ON_wString(&local_1a0,&pOVar10->m_en_family_name);
          Internal_SetFakeNamesFromExistingNames
                    (&local_198,&local_1a0,&loc_family_name,&en_family_name);
          ON_wString::~ON_wString(&local_1a0);
          ON_wString::~ON_wString(&local_198);
          ON_wString::ON_wString(&local_1a8,&pOVar10->m_loc_windows_logfont_name);
          ON_wString::ON_wString(&local_1b0,&pOVar10->m_en_windows_logfont_name);
          Internal_SetFakeNamesFromExistingNames
                    (&local_1a8,&local_1b0,&loc_windows_logfont_name,&en_windows_logfont_name);
          ON_wString::~ON_wString(&local_1b0);
          ON_wString::~ON_wString(&local_1a8);
        }
        if (pOVar5 == (ON_Font *)0x0) {
          WVar3 = Unset;
        }
        else {
          WVar3 = pOVar5->m_font_weight;
        }
        if (pOVar6 == (ON_Font *)0x0) {
          WVar8 = Unset;
        }
        else {
          WVar8 = pOVar6->m_font_weight;
        }
        WVar9 = (Semibold < WVar3) * '\x02' + Bold;
        if (WVar8 != Unset) {
          WVar9 = WVar8;
        }
        if ((((WVar3 == Unset) && (WVar9 = WVar8, WVar8 != Unset)) &&
            (WVar3 = Normal, WVar8 < Medium)) && (WVar3 = Thin, Ultralight < WVar8)) {
          WVar3 = FontWeightFromUnsigned(WVar8 - 2);
        }
      }
      uVar1 = Default.m_logfont_charset;
      WVar8 = Normal;
      if (WVar3 != Unset) {
        WVar8 = WVar3;
      }
      WVar3 = Bold;
      if (WVar9 != Unset) {
        WVar3 = WVar9;
      }
      local_1f8 = &Default;
      ON_Font(&fake_font);
      pwVar4 = ON_wString::operator_cast_to_wchar_t_(rich_text_font_name);
      if ((char)local_17c != '\0') {
        WVar8 = WVar3;
      }
      pOVar5 = &fake_font;
      SetFontCharacteristics
                (pOVar5,0.0,pwVar4,WVar8,bItalicQuartetMember + Upright,Medium,false,false,
                 (double)CONCAT44(in_XMM1_Db,in_XMM1_Da),(uint)uVar1);
      ON_wString::operator=(&fake_font.m_loc_family_name,&loc_family_name);
      ON_wString::operator=(&fake_font.m_en_family_name,&en_family_name);
      ON_wString::operator=(&fake_font.m_loc_windows_logfont_name,&loc_windows_logfont_name);
      ON_wString::operator=(&fake_font.m_en_windows_logfont_name,&en_windows_logfont_name);
      ON_FontFaceQuartet::MemberToString(&local_170,member);
      this = &fake_font.m_loc_face_name;
      ON_wString::operator=(this,&local_170.m_quartet_name);
      ON_wString::~ON_wString(&local_170.m_quartet_name);
      ON_wString::operator=(&fake_font.m_en_face_name,this);
      ON_wString::operator=(&fake_font.m_loc_postscript_name,&ON_wString::EmptyString);
      ON_wString::operator=(&fake_font.m_en_postscript_name,&ON_wString::EmptyString);
      fake_font.m_quartet_member = member;
      if (fake_font.m_runtime_serial_number == 0) {
        pOVar5 = ON_ManagedFonts::GetFromFontCharacteristics
                           (&ON_ManagedFonts::List,&fake_font,false);
      }
      if (pOVar5 != (ON_Font *)0x0) {
        ON_wString::ON_wString(&local_1b8,&pOVar5->m_loc_windows_logfont_name);
        ON_wString::ON_wString(&local_1c0,&pOVar5->m_en_windows_logfont_name);
        Internal_SetFakeNamesFromExistingNames
                  (&local_1b8,&local_1c0,&loc_quartet_name,&en_quartet_name);
        ON_wString::~ON_wString(&local_1c0);
        ON_wString::~ON_wString(&local_1b8);
        ON_wString::ON_wString(&local_1c8,&pOVar5->m_loc_family_name);
        ON_wString::ON_wString(&local_1d0,&pOVar5->m_en_family_name);
        Internal_SetFakeNamesFromExistingNames
                  (&local_1c8,&local_1d0,&loc_family_name,&en_family_name);
        ON_wString::~ON_wString(&local_1d0);
        ON_wString::~ON_wString(&local_1c8);
        ON_wString::ON_wString(&local_1d8,&pOVar5->m_loc_windows_logfont_name);
        ON_wString::ON_wString(&local_1e0,&pOVar5->m_en_windows_logfont_name);
        Internal_SetFakeNamesFromExistingNames
                  (&local_1d8,&local_1e0,&loc_windows_logfont_name,&en_windows_logfont_name);
        ON_wString::~ON_wString(&local_1e0);
        ON_wString::~ON_wString(&local_1d8);
        ON_wString::operator=(&fake_font.m_loc_family_name,&loc_family_name);
        ON_wString::operator=(&fake_font.m_en_family_name,&en_family_name);
        ON_FontFaceQuartet::MemberToString(&local_170,member);
        ON_wString::operator=(this,&local_170.m_quartet_name);
        ON_wString::~ON_wString(&local_170.m_quartet_name);
        ON_wString::operator=(&fake_font.m_en_face_name,this);
        ON_wString::operator=(&fake_font.m_loc_windows_logfont_name,&loc_windows_logfont_name);
        ON_wString::operator=(&fake_font.m_en_windows_logfont_name,&en_windows_logfont_name);
      }
      if (fake_font.m_runtime_serial_number == 0) {
        pOVar5 = ON_ManagedFonts::GetFromFontCharacteristics(&ON_ManagedFonts::List,&fake_font,true)
        ;
      }
      else {
        pOVar5 = &fake_font;
      }
      if (((pOVar5 == (ON_Font *)0x0) || (local_1f8 = pOVar5, pOVar5->m_font_type == InstalledFont))
         || ((pOVar5->m_font_type == ManagedFont &&
             ((pOVar5->m_runtime_serial_number != 0 &&
              (((uint)pOVar5->m_managed_installed_font_and_bits & 3) == 1)))))) {
        pOVar5 = Internal_DecoratedFont(local_1f8,bUnderlined,bStrikethrough);
      }
      else {
        if (((((pOVar5->m_runtime_serial_number == 0) ||
              (((uint)pOVar5->m_managed_installed_font_and_bits & 3) != 2)) ||
             (piVar7 = (int *)(pOVar5->m_managed_installed_font_and_bits & 0xfffffffffffffffc),
             piVar7 == (int *)0x0)) ||
            ((*(char *)((long)piVar7 + 0x1f) != '\x02' &&
             (((*(char *)((long)piVar7 + 0x1f) != '\x01' || (*piVar7 == 0)) ||
              (((uint)*(undefined8 *)(piVar7 + 0x2e) & 3) != 1)))))) ||
           (member != *(Member *)((long)piVar7 + 0x91))) {
          InstalledFontQuartet(&local_170,&Default);
          pOVar6 = ON_FontFaceQuartet::ClosestFace(&local_170,member);
          ON_wString::~ON_wString(&local_170.m_quartet_name);
          if (pOVar6 == (ON_Font *)0x0) {
            pOVar6 = &Default;
          }
          pOVar5->m_managed_installed_font_and_bits = (ulong)pOVar6 | 2;
        }
        pOVar5 = Internal_DecoratedFont(pOVar5,bUnderlined,bStrikethrough);
      }
      ~ON_Font(&fake_font);
      ON_wString::~ON_wString(&en_windows_logfont_name);
      ON_wString::~ON_wString(&loc_windows_logfont_name);
      ON_wString::~ON_wString(&en_family_name);
      ON_wString::~ON_wString(&loc_family_name);
      ON_wString::~ON_wString(&en_quartet_name);
      ON_wString::~ON_wString(&loc_quartet_name);
    }
    else {
      pOVar5 = Internal_DecoratedFont(pOVar5,bUnderlined,bStrikethrough);
    }
    ON_MemoryAllocationTracking::~ON_MemoryAllocationTracking(&disable_tracking);
    ON_wString::~ON_wString(&managed_substitute_quartet.m_quartet_name);
  }
  else {
    pOVar5 = Internal_DecoratedFont(pOVar5,bUnderlined,bStrikethrough);
  }
  ON_wString::~ON_wString(&installed_quartet.m_quartet_name);
  return pOVar5;
}

Assistant:

const ON_Font* ON_Font::FontFromRichTextProperties(
  ON_wString rich_text_font_name,
  bool bBoldQuartetMember,
  bool bItalicQuartetMember,
  bool bUnderlined,
  bool bStrikethrough
)
{
  rich_text_font_name.TrimLeftAndRight();
  if (rich_text_font_name.IsEmpty())
    rich_text_font_name = ON_Font::Default.RichTextFontName();

  const ON_FontFaceQuartet::Member rich_text_quartet_face = ON_FontFaceQuartet::MemberFromBoldAndItalic(bBoldQuartetMember, bItalicQuartetMember);

  ON_FontFaceQuartet installed_quartet = ON_ManagedFonts::InstalledFonts().QuartetFromQuartetName(rich_text_font_name);
  if ( installed_quartet.IsNotEmpty() )
  {
    // Installed font quartets use ClosestFace() because we know all the faces 
    // the real font contains.
    // If you don't get what you want, your asking for something that does not exist.
    // You may need to fix some user interface to not offer the choice that led you here.
    const ON_Font* installed_font = installed_quartet.ClosestFace(rich_text_quartet_face); // DO NOT CHANGE TO Face()
    if (nullptr != installed_font)
      return installed_font->Internal_DecoratedFont( bUnderlined, bStrikethrough);
  }

  const ON_FontFaceQuartet managed_substitute_quartet = ON_ManagedFonts::ManagedFonts().QuartetFromQuartetName(rich_text_font_name);
  if (managed_substitute_quartet.IsNotEmpty())
  {
    // Missing font quartets use Face() because we don't know what the real font quartet looks like.
    const ON_Font* managed_quartet_face = managed_substitute_quartet.Face(rich_text_quartet_face); // DO NOT CHANGE TO ClosestFace()
    if (nullptr != managed_quartet_face)
      return managed_quartet_face->Internal_DecoratedFont(bUnderlined, bStrikethrough); // this missing face has already been added to the quartet
  }

  // We will need to make a new managed font and put it in  a reasonable managed quartet.

  // All memory allocated for managed fonts is permanent app workspace memory.
  ON_MemoryAllocationTracking disable_tracking(false);
  {
    // convert the name to untracked memory so it doesn't look like a leak
    const ON_wString local_str(rich_text_font_name);
    rich_text_font_name = ON_wString::EmptyString;
    rich_text_font_name = ON_wString(static_cast<const wchar_t*>(local_str));
  }

  const ON_Font* installed_font = nullptr;
  installed_font = ON_Font::InstalledFontFromRichTextProperties(rich_text_font_name, bBoldQuartetMember, bItalicQuartetMember);
  if (nullptr == installed_font)
  {
#if defined(ON_RUNTIME_APPLE)
    if (nullptr == installed_font)
      installed_font = ON_Font::InstalledFontList().FromPostScriptName(rich_text_font_name);
#endif
    if (nullptr == installed_font)
      installed_font = ON_Font::InstalledFontList().FromWindowsLogfontName(rich_text_font_name);
#if !defined(ON_RUNTIME_APPLE)
    if (nullptr == installed_font)
      installed_font = ON_Font::InstalledFontList().FromPostScriptName(rich_text_font_name);
#endif
    if (nullptr == installed_font)
      installed_font = ON_Font::InstalledFontList().FromFamilyName(rich_text_font_name, ON_FontFaceQuartet::MemberToString(ON_FontFaceQuartet::Member::Regular) );
    if (nullptr != installed_font)
    {
      installed_quartet = installed_font->InstalledFontQuartet(); // only look at installed quartet!
      const ON_Font* installed_rtfface = installed_quartet.ClosestFace(bBoldQuartetMember, bItalicQuartetMember);
      if (nullptr != installed_rtfface)
        installed_font = installed_rtfface;
    }
  }

  if (nullptr != installed_font)
  {
    // The font is installed on this device.
    return installed_font->Internal_DecoratedFont(bUnderlined, bStrikethrough);
  }


  ON_wString loc_quartet_name = rich_text_font_name;
  ON_wString en_quartet_name = rich_text_font_name;

  ON_wString loc_family_name = rich_text_font_name;
  ON_wString en_family_name = rich_text_font_name;

  ON_wString loc_windows_logfont_name = rich_text_font_name;
  ON_wString en_windows_logfont_name = rich_text_font_name;

  ON_Font::Weight fake_normal_weight = ON_Font::Weight::Unset;
  ON_Font::Weight fake_bold_weight = ON_Font::Weight::Unset;

  if (managed_substitute_quartet.IsNotEmpty())
  {
    // get known names and guesses at weights from the existing parts of the quartet.

    const ON_Font* normal_weight_font = managed_substitute_quartet.Face(ON_FontFaceQuartet::Member::Regular);
    if ( nullptr == normal_weight_font)
      normal_weight_font = managed_substitute_quartet.Face(ON_FontFaceQuartet::Member::Italic);

    const ON_Font* bold_weight_font = managed_substitute_quartet.Face(ON_FontFaceQuartet::Member::Bold);
    if (nullptr == bold_weight_font)
      bold_weight_font = managed_substitute_quartet.Face(ON_FontFaceQuartet::Member::BoldItalic);

    const ON_Font* names_font = (nullptr != normal_weight_font) ? normal_weight_font : bold_weight_font;

    if (nullptr != names_font)
    {
      Internal_SetFakeNamesFromExistingNames(
        names_font->QuartetName(ON_Font::NameLocale::Localized),
        names_font->QuartetName(ON_Font::NameLocale::English),
        loc_quartet_name,
        en_quartet_name
      );

      Internal_SetFakeNamesFromExistingNames(
        names_font->FamilyName(ON_Font::NameLocale::Localized),
        names_font->FamilyName(ON_Font::NameLocale::English),
        loc_family_name,
        en_family_name
      );

      Internal_SetFakeNamesFromExistingNames(
        names_font->WindowsLogfontName(ON_Font::NameLocale::Localized),
        names_font->WindowsLogfontName(ON_Font::NameLocale::English),
        loc_windows_logfont_name,
        en_windows_logfont_name
      );
    }

    if (nullptr != normal_weight_font)
      fake_normal_weight = normal_weight_font->FontWeight();
    if (nullptr != bold_weight_font)
      fake_bold_weight = bold_weight_font->FontWeight();

    const unsigned normal_unsigned = static_cast<unsigned>(fake_normal_weight);
    const unsigned bold_unsigned = static_cast<unsigned>(fake_bold_weight);
    const unsigned default_normal_unsigned = static_cast<unsigned>(ON_Font::Weight::Normal);
    const unsigned default_bold_unsigned = static_cast<unsigned>(ON_Font::Weight::Bold);
    const unsigned min_weight = static_cast<unsigned>(ON_Font::Weight::Thin);
    const unsigned max_weight = static_cast<unsigned>(ON_Font::Weight::Heavy);

    if (ON_Font::Weight::Unset != fake_normal_weight && ON_Font::Weight::Unset == fake_bold_weight)
    {
      // have to guess at a bold weight
      fake_bold_weight
        = normal_unsigned < default_bold_unsigned
        ? ON_Font::Weight::Bold
        : ((normal_unsigned + 2 <= max_weight) ? ON_Font::FontWeightFromUnsigned(normal_unsigned + 2) : ON_Font::Weight::Heavy)
        ;
    }

    if (ON_Font::Weight::Unset != fake_bold_weight && ON_Font::Weight::Unset == fake_normal_weight)
    {
      // have to guess at a normal weight
      fake_normal_weight
        = bold_unsigned > default_normal_unsigned
        ? ON_Font::Weight::Normal
        : ((min_weight + 2 <= bold_unsigned) ? ON_Font::FontWeightFromUnsigned(bold_unsigned - 2) : ON_Font::Weight::Thin)
        ;
    }
  }

  if (ON_Font::Weight::Unset == fake_normal_weight)
    fake_normal_weight = ON_Font::Weight::Normal;
  if (ON_Font::Weight::Unset == fake_bold_weight)
    fake_bold_weight = ON_Font::Weight::Bold;

  const double point_size = 0.0;
  const unsigned int logfont_charset = ON_Font::Default.LogfontCharSet();

  ON_Font fake_font;
  fake_font.SetFontCharacteristics(
    point_size,
    rich_text_font_name,
    bBoldQuartetMember ? fake_bold_weight : fake_normal_weight,
    bItalicQuartetMember ? ON_Font::Style::Italic : ON_Font::Style::Upright,
    ON_Font::Stretch::Medium,
    false, // DO NOT PASS bUnderlined here
    false, // DO NOT PASS bStrikethrough here
    ON_FontMetrics::DefaultLineFeedRatio,
    logfont_charset
  );

  fake_font.m_loc_family_name = loc_family_name;
  fake_font.m_en_family_name = en_family_name;

  fake_font.m_loc_windows_logfont_name = loc_windows_logfont_name;
  fake_font.m_en_windows_logfont_name = en_windows_logfont_name;

  // There is no reliable way to get the face name  - we fake it by using the quartet face name below
  fake_font.m_loc_face_name = ON_FontFaceQuartet::MemberToString(rich_text_quartet_face);
  fake_font.m_en_face_name = fake_font.m_loc_face_name;

  // There is no reliable way to get the PostScript name 
  fake_font.m_loc_postscript_name = ON_wString::EmptyString;
  fake_font.m_en_postscript_name = ON_wString::EmptyString;

  fake_font.m_quartet_member = rich_text_quartet_face;

  // When reading 3dm files created on a device with other fonts
  // Frequently a managed font is added when a dimstyle is read.
  // Later on annotation objects are read and rich text requests
  // regular/bold/italic/bold-italic faces from the dimstyle font's 
  // quartet. When existing_managed_font is not nullptr, we need
  // to create a fake quartet containing that font.
  // When existing_managed_font is nullptr, we need to create
  // a fake quartet based on only the rtf_font_name.
  // (Sure wish we had not dumped the V5 font table, sigh.)
  const ON_Font* existing_managed_font = ON_Font::GetManagedFont(fake_font, false);

  if (nullptr != existing_managed_font)
  {
    Internal_SetFakeNamesFromExistingNames(
      existing_managed_font->QuartetName(ON_Font::NameLocale::Localized),
      existing_managed_font->QuartetName(ON_Font::NameLocale::English),
      loc_quartet_name,
      en_quartet_name
    );

    Internal_SetFakeNamesFromExistingNames(
      existing_managed_font->FamilyName(ON_Font::NameLocale::Localized),
      existing_managed_font->FamilyName(ON_Font::NameLocale::English),
      loc_family_name,
      en_family_name
    );

    Internal_SetFakeNamesFromExistingNames(
      existing_managed_font->WindowsLogfontName(ON_Font::NameLocale::Localized),
      existing_managed_font->WindowsLogfontName(ON_Font::NameLocale::English),
      loc_windows_logfont_name,
      en_windows_logfont_name
    );

    fake_font.m_loc_family_name = loc_family_name;
    fake_font.m_en_family_name = en_family_name;

    fake_font.m_loc_face_name = ON_FontFaceQuartet::MemberToString(rich_text_quartet_face);
    fake_font.m_en_face_name = fake_font.m_loc_face_name;

    fake_font.m_loc_windows_logfont_name = loc_windows_logfont_name;
    fake_font.m_en_windows_logfont_name = en_windows_logfont_name;
  }

  // Need to make a fake rich text quartet of managed fonts so rich text 
  // bold and italic faces work as expected.

  // creating a managed fake font resets the fake quartets
  // and this fake will get added to the quartets next time
  // they are needed.
  const ON_Font* managed_fake_font = ON_Font::GetManagedFont(fake_font, true);

  if (nullptr == managed_fake_font)
  {
    // should never happen
    return ON_Font::Default.Internal_DecoratedFont(bUnderlined, bStrikethrough);
  }

  if (managed_fake_font->IsInstalledFont())
  {
    return managed_fake_font->Internal_DecoratedFont(bUnderlined, bStrikethrough);
  }

  // set installed substitute used to render the missing font
  const ON_Font* installed_substitute = managed_fake_font->SubstituteFont();
  if (nullptr == installed_substitute || false == installed_substitute->IsInstalledFont() || rich_text_quartet_face != installed_substitute->m_quartet_member)
  {
    // We have better information to select the correct substitute than inside the ON_Font::GetManagedFont(fake_font, true) call above.
    // Use this information to specify a better substitute font.
    installed_substitute = ON_Font::Default.InstalledFontQuartet().ClosestFace(rich_text_quartet_face); // only look at installed quartet
    if (nullptr == installed_substitute)
      installed_substitute = &ON_Font::Default;
    const bool bInstalledFontIsASubstitute = true;
    ON_Font::Internal_SetManagedFontInstalledFont(
      managed_fake_font,
      installed_substitute,
      bInstalledFontIsASubstitute
    );
  }

  return managed_fake_font->Internal_DecoratedFont(bUnderlined, bStrikethrough);
}